

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<long_double>::AddKel
          (TPZFYsmpMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int64_t iVar4;
  long *plVar5;
  longdouble *plVar6;
  ostream *poVar7;
  void *this_00;
  TPZVec<long> *in_RCX;
  TPZVec<long> *in_RDX;
  long *in_RSI;
  long in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar8;
  longdouble lVar9;
  int flag;
  int64_t jpos;
  int64_t ipos;
  longdouble value;
  int64_t k;
  int64_t j;
  int64_t i;
  undefined8 in_stack_ffffffffffffff22;
  long local_38;
  long local_30;
  long local_28;
  
  local_38 = 0;
  local_28 = 0;
  lVar8 = in_ST6;
  do {
    iVar4 = TPZVec<long>::NElements(in_RDX);
    if (iVar4 <= local_28) {
      return;
    }
    for (local_30 = 0; iVar4 = TPZVec<long>::NElements(in_RDX), local_30 < iVar4;
        local_30 = local_30 + 1) {
      plVar5 = TPZVec<long>::operator[](in_RCX,local_28);
      iVar4 = *plVar5;
      plVar5 = TPZVec<long>::operator[](in_RCX,local_30);
      lVar1 = *plVar5;
      plVar5 = TPZVec<long>::operator[](in_RDX,local_28);
      lVar2 = *plVar5;
      plVar5 = TPZVec<long>::operator[](in_RDX,local_30);
      (**(code **)(*in_RSI + 0x120))(in_RSI,lVar2,*plVar5);
      lVar9 = lVar8;
      bVar3 = IsZero((longdouble)
                     CONCAT82(in_stack_ffffffffffffff22,(short)((unkuint10)in_ST0 >> 0x40)));
      if (!bVar3) {
        bVar3 = false;
        local_38 = local_38 + 1;
        plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),iVar4);
        if (((local_38 < *plVar5) ||
            (plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),iVar4 + 1),
            *plVar5 <= local_38)) ||
           (plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_38),
           *plVar5 != lVar1)) {
          plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),iVar4);
          for (local_38 = *plVar5;
              plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),iVar4 + 1),
              local_38 < *plVar5; local_38 = local_38 + 1) {
            plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_38);
            if ((*plVar5 == lVar1) ||
               (plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_38),
               *plVar5 == -1)) {
              bVar3 = true;
              plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_38);
              if (*plVar5 == -1) {
                plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_38);
                *plVar5 = lVar1;
                plVar6 = TPZVec<long_double>::operator[]
                                   ((TPZVec<long_double> *)(in_RDI + 0x60),local_38);
                *plVar6 = in_ST0;
                lVar9 = lVar8;
              }
              else {
                plVar6 = TPZVec<long_double>::operator[]
                                   ((TPZVec<long_double> *)(in_RDI + 0x60),local_38);
                *plVar6 = *plVar6 + in_ST0;
                lVar8 = in_ST6;
                lVar9 = in_ST6;
              }
              break;
            }
          }
        }
        else {
          plVar6 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 0x60),local_38);
          *plVar6 = *plVar6 + in_ST0;
          bVar3 = true;
          lVar8 = in_ST6;
          lVar9 = in_ST6;
        }
        if (!bVar3) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line ="
                                  );
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
          poVar7 = std::operator<<(poVar7," column =");
          this_00 = (void *)std::ostream::operator<<(poVar7,lVar1);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
      }
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = lVar8;
      lVar8 = lVar9;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & sourceindex, TPZVec<int64_t> & destinationindex){
	int64_t i,j,k = 0;
	TVar value=0.;
	int64_t ipos,jpos;
	for(i=0;i<sourceindex.NElements();i++){
		for(j=0;j<sourceindex.NElements();j++){
			ipos=destinationindex[i];
			jpos=destinationindex[j];
			value=elmat.GetVal(sourceindex[i],sourceindex[j]);
            //cout << "j= " << j << endl;
			if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
				int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
				if(!flag) cout << "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << endl;         }
		}
	}
}